

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcplisten.c
# Opt level: O1

int tcp_listener_set_listen_fd(void *arg,void *buf,size_t sz,nni_type t)

{
  nni_mtx *mtx;
  int iVar1;
  int iVar2;
  int *piVar3;
  undefined1 local_a0 [8];
  sockaddr_storage ss;
  int fd;
  socklen_t len;
  
  ss.__ss_align._4_4_ = 0x80;
  iVar1 = nni_copyin_int((int *)&ss.__ss_align,buf,sz,0,0x7fffffff,t);
  if (iVar1 == 0) {
    iVar1 = getsockname((int)ss.__ss_align,(sockaddr *)local_a0,
                        (socklen_t *)((long)&ss.__ss_align + 4));
    if (iVar1 == 0) {
      iVar2 = nni_posix_sockaddr2nn
                        ((nni_sockaddr *)((long)arg + 0x50),local_a0,(ulong)ss.__ss_align._4_4_);
      iVar1 = 0xf;
      if ((iVar2 == 0) && ((local_a0._0_2_ & 0xfff7) == 2)) {
        mtx = (nni_mtx *)((long)arg + 0x130);
        nni_mtx_lock(mtx);
        if (*(char *)((long)arg + 0x128) == '\x01') {
          nni_mtx_unlock(mtx);
          iVar1 = 4;
        }
        else if (*(char *)((long)arg + 0x129) == '\x01') {
          nni_mtx_unlock(mtx);
          iVar1 = 7;
        }
        else {
          nni_posix_pfd_init((nni_posix_pfd *)((long)arg + 0xd8),(int)ss.__ss_align,tcp_listener_cb,
                             arg);
          *(undefined1 *)((long)arg + 0x128) = 1;
          nni_mtx_unlock(mtx);
          iVar1 = 0;
        }
      }
    }
    else {
      piVar3 = __errno_location();
      iVar1 = nni_plat_errno(*piVar3);
    }
  }
  return iVar1;
}

Assistant:

static int
tcp_listener_set_listen_fd(void *arg, const void *buf, size_t sz, nni_type t)
{
	tcp_listener           *l = arg;
	int                     fd;
	struct sockaddr_storage ss;
	socklen_t               len = sizeof(ss);
	int                     rv;

	if ((rv = nni_copyin_int(&fd, buf, sz, 0, NNI_MAXINT, t)) != 0) {
		return (rv);
	}

	if (getsockname(fd, (void *) &ss, &len) != 0) {
		return (nni_plat_errno(errno));
	}

	if (((nni_posix_sockaddr2nn(&l->sa, &ss, len)) != 0) ||
#ifdef NNG_ENABLE_IPV6
	    ((ss.ss_family != AF_INET) && (ss.ss_family != AF_INET6))
#else
	    (ss.ss_family != AF_INET)
#endif
	) {
		return (NNG_EADDRINVAL);
	}

	nni_mtx_lock(&l->mtx);
	if (l->started) {
		nni_mtx_unlock(&l->mtx);
		return (NNG_EBUSY);
	}
	if (l->closed) {
		nni_mtx_unlock(&l->mtx);
		return (NNG_ECLOSED);
	}
	nni_posix_pfd_init(&l->pfd, fd, tcp_listener_cb, l);
	l->started = true;
	nni_mtx_unlock(&l->mtx);
	return (0);
}